

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.h
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::Formatter::operator()
          (Formatter *this,char *format,char **args,unsigned_long *args_1,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_3,int *args_4,
          unsigned_long *args_5,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_6)

{
  int x;
  unsigned_long x_00;
  unsigned_long x_01;
  long lVar1;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  allocator_type local_15a;
  allocator local_159;
  Printer *local_158;
  char *local_150;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_148;
  string local_130 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  string local_f0;
  string local_d0 [32];
  string local_b0 [32];
  string local_90;
  string local_70;
  string local_50 [32];
  
  local_158 = this->printer_;
  local_150 = format;
  std::__cxx11::string::string(local_130,*args,&local_159);
  std::__cxx11::string::string((string *)&local_110,local_130);
  ToString<unsigned_long,void>(&local_f0,(Formatter *)*args_1,x_00);
  std::__cxx11::string::string(local_d0,(string *)args_2);
  std::__cxx11::string::string(local_b0,(string *)args_3);
  ToString<int,void>(&local_90,(Formatter *)(ulong)(uint)*args_4,x);
  ToString<unsigned_long,void>(&local_70,(Formatter *)*args_5,x_01);
  std::__cxx11::string::string(local_50,(string *)args_6);
  __l._M_len = 7;
  __l._M_array = &local_110;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_148,__l,&local_15a);
  io::Printer::FormatInternal(local_158,&local_148,&this->vars_,local_150);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_148);
  lVar1 = 0xc0;
  do {
    std::__cxx11::string::~string((string *)((long)&local_110._M_dataplus._M_p + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  std::__cxx11::string::~string(local_130);
  return;
}

Assistant:

void operator()(const char* format, const Args&... args) const {
    printer_->FormatInternal({ToString(args)...}, vars_, format);
  }